

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

int count_dups<std::vector<int,std::allocator<int>>>
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *t)

{
  long lVar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar2;
  bool bVar3;
  size_type sVar4;
  size_t __n;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  reference local_40;
  undefined1 *local_38;
  int local_30;
  int local_2c;
  int j;
  int i;
  unsigned_long __vla_expr0;
  int local_18;
  int local_14;
  int N;
  int dups;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *t_local;
  
  local_14 = 0;
  uStack_50 = 0x1139ac;
  _N = t;
  sVar4 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(t);
  local_18 = (int)sVar4;
  uStack_50 = 0x1139b8;
  _j = std::
       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ::size(_N);
  lVar1 = -(_j + 0xf & 0xfffffffffffffff0);
  __n = (size_t)local_18;
  local_38 = auStack_48 + lVar1;
  __vla_expr0 = (unsigned_long)auStack_48;
  *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x1139e9;
  memset(auStack_48 + lVar1,0,__n);
  for (local_2c = 0; local_2c < local_18; local_2c = local_2c + 1) {
    local_30 = local_2c;
    if ((local_38[local_2c] & 1) == 0) {
      while (pvVar2 = _N, local_30 = local_30 + 1, local_30 < local_18) {
        sVar4 = (size_type)local_2c;
        *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x113a2a;
        local_40 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](pvVar2,sVar4);
        pvVar2 = _N;
        sVar4 = (size_type)local_30;
        *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x113a3b;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](pvVar2,sVar4);
        *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x113a47;
        bVar3 = std::operator==(*(vector<int,_std::allocator<int>_> **)((long)&__vla_expr0 + lVar1),
                                *(vector<int,_std::allocator<int>_> **)((long)&j + lVar1));
        if (bVar3) {
          local_14 = local_14 + 1;
          local_38[local_30] = 1;
        }
      }
    }
  }
  return local_14;
}

Assistant:

int count_dups(std::vector<T> &t)
{
    int dups = 0;
    int N = t.size();
    STACKALLOC(bool, mark, t.size());
    memset(mark, 0, N);
    for(int i=0; i<N; ++i) {
        if(mark[i])
            continue;
        for(int j=i+1; j<N; ++j) {
            if(t[i] == t[j]) {
                dups++;
                mark[j] = true;
            }
        }
    }
    return dups;
}